

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

ostream * maths::operator<<(ostream *os,Matrix *m)

{
  ostream *this;
  int *in_RSI;
  ostream *in_RDI;
  int j;
  int i;
  int local_18;
  int local_14;
  
  for (local_14 = 0; local_14 < *in_RSI; local_14 = local_14 + 1) {
    std::ostream::operator<<(in_RDI,**(double **)(*(long *)(in_RSI + 2) + (long)local_14 * 8));
    for (local_18 = 1; local_18 < in_RSI[1]; local_18 = local_18 + 1) {
      this = std::operator<<(in_RDI," ");
      std::ostream::operator<<
                (this,*(double *)
                       (*(long *)(*(long *)(in_RSI + 2) + (long)local_14 * 8) + (long)local_18 * 8))
      ;
    }
    std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  }
  return in_RDI;
}

Assistant:

ostream& operator<<(ostream& os, const Matrix& m)
{
    for (int i = 0; i < m.rows_; ++i) {
        os << m.p[i][0];
        for (int j = 1; j < m.cols_; ++j) {
            os << " " << m.p[i][j];
        }
        os << endl;
    }
    return os;
}